

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::generateRandomBlocks
               (deUint8 *dst,size_t numBlocks,CompressedTexFormat format,deUint32 seed)

{
  deUint8 *curBlockPtr;
  size_t numBlocksGenerated;
  Random rnd;
  IVec3 blockSize;
  deUint32 seed_local;
  CompressedTexFormat format_local;
  size_t numBlocks_local;
  deUint8 *dst_local;
  
  getBlockPixelSize((tcu *)&rnd.m_rnd.z,format);
  de::Random::Random((Random *)((long)&numBlocksGenerated + 4),seed);
  for (curBlockPtr = (deUint8 *)0x0; curBlockPtr < numBlocks; curBlockPtr = curBlockPtr + 1) {
    anon_unknown_0::generateRandomBlock
              (dst + (long)curBlockPtr * 0x10,(IVec3 *)&rnd.m_rnd.z,
               (Random *)((long)&numBlocksGenerated + 4));
  }
  de::Random::~Random((Random *)((long)&numBlocksGenerated + 4));
  return;
}

Assistant:

void generateRandomBlocks (deUint8* dst, size_t numBlocks, CompressedTexFormat format, deUint32 seed)
{
	const IVec3		blockSize			= getBlockPixelSize(format);
	de::Random		rnd					(seed);
	size_t			numBlocksGenerated	= 0;

	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(blockSize.z() == 1);

	for (numBlocksGenerated = 0; numBlocksGenerated < numBlocks; numBlocksGenerated++)
	{
		deUint8* const	curBlockPtr		= dst + numBlocksGenerated*BLOCK_SIZE_BYTES;

		generateRandomBlock(curBlockPtr, blockSize, rnd);
	}
}